

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene::SerializeWithCachedSizes
          (VisionFeaturePrint_Scene *this,CodedOutputStream *output)

{
  if (this->version_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(1,this->version_,output);
    return;
  }
  return;
}

Assistant:

void VisionFeaturePrint_Scene::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene.SceneVersion version = 1;
  if (this->version() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->version(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene)
}